

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_enctropy.c
# Opt level: O1

void h265e_cabac_finish(H265eCabacCtx *cabac_ctx)

{
  int iVar1;
  MppWriteCtx *ctx;
  
  ctx = cabac_ctx->m_bitIf;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_cabac","enter\n","h265e_cabac_finish");
  }
  if (cabac_ctx->m_low >> ((char)cabac_ctx->m_bitsLeft + 0x15U & 0x1f) == 0) {
    if (0 < cabac_ctx->m_numBufferedBytes) {
      mpp_writer_put_bits(ctx,cabac_ctx->m_bufferedByte,8);
    }
    if (1 < cabac_ctx->m_numBufferedBytes) {
      do {
        mpp_writer_put_bits(ctx,0xff,8);
        iVar1 = cabac_ctx->m_numBufferedBytes;
        cabac_ctx->m_numBufferedBytes = iVar1 + -1;
      } while (2 < iVar1);
    }
  }
  else {
    mpp_writer_put_bits(ctx,cabac_ctx->m_bufferedByte + 1,8);
    if (1 < cabac_ctx->m_numBufferedBytes) {
      do {
        mpp_writer_put_bits(ctx,0,8);
        iVar1 = cabac_ctx->m_numBufferedBytes;
        cabac_ctx->m_numBufferedBytes = iVar1 + -1;
      } while (2 < iVar1);
    }
    cabac_ctx->m_low = cabac_ctx->m_low + (-1 << ((char)cabac_ctx->m_bitsLeft + 0x15U & 0x1f));
  }
  mpp_writer_put_bits(ctx,cabac_ctx->m_low >> 8,cabac_ctx->m_bitsLeft + 0xd);
  if (((byte)h265e_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"h265e_cabac","leave\n","h265e_cabac_finish");
  return;
}

Assistant:

void h265e_cabac_finish(H265eCabacCtx *cabac_ctx)
{
    MppWriteCtx* s = cabac_ctx->m_bitIf;

    h265e_dbg_func("enter\n");

    if (cabac_ctx->m_low >> (21 + cabac_ctx->m_bitsLeft)) {

        mpp_writer_put_bits(s, cabac_ctx->m_bufferedByte + 1, 8);
        while (cabac_ctx->m_numBufferedBytes > 1) {
            mpp_writer_put_bits(s, 0, 8);
            cabac_ctx->m_numBufferedBytes--;
        }

        cabac_ctx->m_low -= 1 << (21 + cabac_ctx->m_bitsLeft);
    } else {
        if (cabac_ctx->m_numBufferedBytes > 0) {

            mpp_writer_put_bits(s, cabac_ctx->m_bufferedByte , 8);
        }
        while (cabac_ctx->m_numBufferedBytes > 1) {
            mpp_writer_put_bits(s, 0xff , 8);
            cabac_ctx->m_numBufferedBytes--;
        }
    }
    mpp_writer_put_bits(s, cabac_ctx->m_low >> 8 , 13 + cabac_ctx->m_bitsLeft);

    h265e_dbg_func("leave\n");
}